

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

unique_ptr<cmInstallTargetGenerator,_std::default_delete<cmInstallTargetGenerator>_> __thiscall
anon_unknown.dwarf_edd4ff::CreateInstallTargetGenerator
          (anon_unknown_dwarf_edd4ff *this,cmTarget *target,cmInstallCommandArguments *args,
          bool impLib,cmListFileBacktrace *backtrace,string *destination,bool forceOpt,bool namelink
          )

{
  pointer *ppcVar1;
  bool bVar2;
  cmMakefile *mf;
  string *__args_1;
  string *__args_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_5;
  bool impLib_local;
  undefined1 local_56;
  bool local_55;
  MessageLevel message;
  string *local_50;
  pointer *__ptr;
  undefined8 local_40;
  cmListFileBacktrace *local_38;
  
  impLib_local = impLib;
  __ptr = (pointer *)this;
  local_40 = destination;
  local_38 = backtrace;
  mf = cmTarget::GetMakefile(target);
  message = cmInstallGenerator::SelectMessageLevel(mf,false);
  cmTarget::SetHaveInstallRule(target,true);
  if (namelink) {
    local_50 = cmInstallCommandArguments::GetNamelinkComponent_abi_cxx11_(args);
  }
  else {
    local_50 = cmInstallCommandArguments::GetComponent_abi_cxx11_(args);
  }
  __args_1 = cmTarget::GetName_abi_cxx11_(target);
  __args_4 = cmInstallCommandArguments::GetPermissions_abi_cxx11_(args);
  __args_5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             cmInstallCommandArguments::GetConfigurations_abi_cxx11_(args);
  local_55 = cmInstallCommandArguments::GetExcludeFromAll(args);
  bVar2 = cmInstallCommandArguments::GetOptional(args);
  ppcVar1 = __ptr;
  local_56 = bVar2 || forceOpt;
  std::
  make_unique<cmInstallTargetGenerator,std::__cxx11::string_const&,std::__cxx11::string_const&,bool&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,cmInstallGenerator::MessageLevel&,bool,bool,cmListFileBacktrace_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__ptr,__args_1,
             (bool *)local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&impLib_local,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__args_4,__args_5,(MessageLevel *)local_50,(bool *)&message,&local_55,
             (cmListFileBacktrace *)&local_56);
  cmTarget::AddInstallGenerator(target,*ppcVar1);
  return (__uniq_ptr_data<cmInstallTargetGenerator,_std::default_delete<cmInstallTargetGenerator>,_true,_true>
          )(__uniq_ptr_data<cmInstallTargetGenerator,_std::default_delete<cmInstallTargetGenerator>,_true,_true>
            )ppcVar1;
}

Assistant:

std::unique_ptr<cmInstallTargetGenerator> CreateInstallTargetGenerator(
  cmTarget& target, const cmInstallCommandArguments& args, bool impLib,
  cmListFileBacktrace const& backtrace, const std::string& destination,
  bool forceOpt = false, bool namelink = false)
{
  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(target.GetMakefile());
  target.SetHaveInstallRule(true);
  const std::string& component =
    namelink ? args.GetNamelinkComponent() : args.GetComponent();
  auto g = cm::make_unique<cmInstallTargetGenerator>(
    target.GetName(), destination, impLib, args.GetPermissions(),
    args.GetConfigurations(), component, message, args.GetExcludeFromAll(),
    args.GetOptional() || forceOpt, backtrace);
  target.AddInstallGenerator(g.get());
  return g;
}